

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O2

BinaryOp * __thiscall verilogAST::BinaryOp::clone_impl(BinaryOp *this)

{
  BinOp BVar1;
  int iVar2;
  int iVar3;
  BinaryOp *pBVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  pBVar4 = (BinaryOp *)operator_new(0x20);
  iVar2 = (*(((this->left)._M_t.
              super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
              .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node).
            _vptr_Node[3])();
  BVar1 = this->op;
  iVar3 = (*(((this->right)._M_t.
              super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>
              .super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl)->super_Node).
            _vptr_Node[3])();
  (pBVar4->super_Expression).super_Node._vptr_Node = (_func_int **)&PTR_toString_abi_cxx11__001856c0
  ;
  (pBVar4->left)._M_t.
  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>._M_t.
  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>.
  super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl =
       (Expression *)CONCAT44(extraout_var,iVar2);
  pBVar4->op = BVar1;
  (pBVar4->right)._M_t.
  super___uniq_ptr_impl<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>._M_t.
  super__Tuple_impl<0UL,_verilogAST::Expression_*,_std::default_delete<verilogAST::Expression>_>.
  super__Head_base<0UL,_verilogAST::Expression_*,_false>._M_head_impl =
       (Expression *)CONCAT44(extraout_var_00,iVar3);
  return pBVar4;
}

Assistant:

virtual BinaryOp* clone_impl() const override {
    return new BinaryOp(this->left->clone(), this->op, this->right->clone());
  }